

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

void __thiscall
QHttp2Stream::streamError(QHttp2Stream *this,Http2Error errorCode,QLatin1StringView message)

{
  uint uVar1;
  undefined8 uVar2;
  storage_type *psVar3;
  undefined8 uVar4;
  storage_type *psVar5;
  char *__s;
  storage_type *psVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QArrayData *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  char *local_40;
  long local_38;
  
  __s = message.m_data;
  psVar6 = (storage_type *)message.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qHttp2ConnectionLog();
  if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) ==
      0) {
    psVar5 = (storage_type *)0x0;
    if (0 < (long)psVar6) {
      psVar5 = psVar6;
    }
  }
  else {
    local_58._0_4_ = 2;
    local_58._4_4_ = 0;
    uStack_50._0_4_ = 0;
    uStack_50._4_4_ = 0;
    uStack_48._0_4_ = 0;
    uStack_48._4_4_ = 0;
    local_40 = qHttp2ConnectionLog::category.name;
    uVar2 = QMetaObject::cast((QObject *)&QHttp2Connection::staticMetaObject);
    uVar1 = *(uint *)(this + 0x10);
    psVar5 = (storage_type *)0x0;
    if (0 < (long)psVar6) {
      psVar5 = psVar6;
    }
    psVar3 = psVar5;
    if (__s == (char *)0x0) {
      psVar3 = (storage_type *)0x0;
    }
    if (__s != (char *)0x0 && (long)psVar6 < 0) {
      psVar3 = (storage_type *)strlen(__s);
    }
    QVar7.m_data = psVar3;
    QVar7.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar7);
    local_98 = local_78;
    uStack_90 = uStack_70;
    local_88 = local_68;
    uVar4 = QString::utf16();
    QMessageLogger::debug
              ((char *)&local_58,"[%p] stream %u finished with error: %ls (error code: %u)",uVar2,
               (ulong)uVar1,uVar4,(ulong)errorCode);
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,0x10);
      }
    }
  }
  sendRST_STREAM(this,errorCode);
  if (__s == (char *)0x0) {
    psVar5 = (storage_type *)0x0;
  }
  if (__s != (char *)0x0 && (long)psVar6 < 0) {
    psVar5 = (storage_type *)strlen(__s);
  }
  QVar8.m_data = psVar5;
  QVar8.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar8);
  local_78 = (QArrayData *)CONCAT44(local_58._4_4_,(undefined4)local_58);
  uStack_70 = CONCAT44(uStack_50._4_4_,(undefined4)uStack_50);
  local_68 = CONCAT44(uStack_48._4_4_,(undefined4)uStack_48);
  uStack_50 = &local_98;
  local_98 = (QArrayData *)CONCAT44(local_98._4_4_,errorCode);
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  uStack_48 = &local_78;
  QMetaObject::activate((QObject *)this,&staticMetaObject,2,(void **)&local_58);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Stream::streamError(Http2::Http2Error errorCode,
                               QLatin1StringView message)
{
    qCDebug(qHttp2ConnectionLog, "[%p] stream %u finished with error: %ls (error code: %u)",
            getConnection(), m_streamID, qUtf16Printable(message), errorCode);

    sendRST_STREAM(errorCode);
    emit errorOccurred(errorCode, message);
}